

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

int rottenfood(obj *obj)

{
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  int tmp;
  char *pcVar4;
  int iVar5;
  int tmp_1;
  int iVar6;
  char *pcVar7;
  
  foodword(obj);
  pline("Blecch!  Rotten %s!");
  uVar2 = mt_random();
  if ((uVar2 & 3) == 0) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      body_part(10);
      pline("You feel rather %s.");
    }
    else {
      pline("You feel rather trippy.");
    }
    uVar2 = u.uprops[0x1c].intrinsic;
    iVar6 = 2;
    iVar5 = -2;
    do {
      uVar3 = mt_random();
      iVar6 = iVar6 + (uVar3 & 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    make_confused((ulong)(iVar6 + uVar2),'\0');
    return 0;
  }
  uVar2 = mt_random();
  if ((uVar2 & 3) == 0) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018fab3;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018faaa;
LAB_0018fbe7:
      pline("Everything suddenly goes dark.");
      uVar2 = 2;
      iVar5 = -2;
      do {
        uVar3 = mt_random();
        uVar2 = uVar2 + uVar3 % 10;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
      make_blinded((ulong)uVar2,'\0');
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0018fd31;
          goto LAB_0018fc3d;
        }
      }
      else {
LAB_0018fc3d:
        if (ublindf == (obj *)0x0) {
          return 0;
        }
      }
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
LAB_0018fd31:
      pline("Your vision quickly clears.");
      return 0;
    }
LAB_0018faaa:
    if (ublindf != (obj *)0x0) {
LAB_0018fab3:
      if (ublindf->oartifact == '\x1d') goto LAB_0018fbe7;
    }
  }
  uVar2 = mt_random();
  if (0x55555555 < uVar2 * -0x55555555) {
    return 0;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018fae6;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018fae1;
LAB_0018fc7b:
    pcVar7 = "dark";
    pcVar4 = "goes";
  }
  else {
LAB_0018fae1:
    if (ublindf != (obj *)0x0) {
LAB_0018fae6:
      if (ublindf->oartifact == '\x1d') goto LAB_0018fc7b;
    }
    pcVar7 = "yourself";
    pcVar4 = "you lose control of";
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) &&
        (bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 == '\0')) &&
       (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
      pcVar4 = "you slap against the";
      if (u.usteed == (monst *)0x0) {
        pcVar7 = surface((int)u.ux,(int)u.uy);
      }
      else {
        pcVar7 = "saddle";
      }
    }
  }
  pline("The world spins and %s %s.",pcVar4,pcVar7);
  flags.soundok = '\0';
  uVar2 = mt_random();
  nomul(~(uVar2 % 10),"unconscious from rotten food");
  nomovemsg = "You are conscious again.";
  afternmv = Hear_again;
  return 1;
}

Assistant:

static int rottenfood(struct obj *obj)
{
	pline("Blecch!  Rotten %s!", foodword(obj));
	if (!rn2(4)) {
		if (Hallucination) pline("You feel rather trippy.");
		else pline("You feel rather %s.", body_part(LIGHT_HEADED));
		make_confused(HConfusion + dice(2,4), FALSE);
	} else if (!rn2(4) && !Blind) {
		pline("Everything suddenly goes dark.");
		make_blinded((long)dice(2,10), FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	} else if (!rn2(3)) {
		const char *what, *where;
		if (!Blind)
		    what = "goes",  where = "dark";
		else if (Levitation || Is_airlevel(&u.uz) ||
			 Is_waterlevel(&u.uz))
		    what = "you lose control of",  where = "yourself";
		else
		    what = "you slap against the", where =
			   (u.usteed) ? "saddle" :
			   surface(u.ux,u.uy);
		pline("The world spins and %s %s.", what, where);
		flags.soundok = 0;
		nomul(-rnd(10), "unconscious from rotten food");
		nomovemsg = "You are conscious again.";
		afternmv = Hear_again;
		return 1;
	}
	return 0;
}